

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

void __thiscall
Js::TypedArrayBase::ExtractSnapObjectDataInto
          (TypedArrayBase *this,SnapObject *objData,SlabAllocator *alloc)

{
  uint32 uVar1;
  ArrayBufferBase **ppAVar2;
  ArrayBufferBase *local_40;
  unsigned_long *local_38;
  TTD_PTR_ID *depArray;
  SnapTypedArrayInfo *local_28;
  SnapTypedArrayInfo *stai;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  TypedArrayBase *this_local;
  
  stai = (SnapTypedArrayInfo *)alloc;
  alloc_local = (SlabAllocator *)objData;
  objData_local = (SnapObject *)this;
  local_28 = TTD::SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapTypedArrayInfo>
                       (alloc);
  depArray = (TTD_PTR_ID *)ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  ppAVar2 = Memory::PointerValue<Js::ArrayBufferBase>((ArrayBufferBase **)&depArray);
  local_28->ArrayBufferAddr = (TTD_PTR_ID)*ppAVar2;
  uVar1 = GetByteOffset(this);
  local_28->ByteOffset = uVar1;
  uVar1 = ArrayObject::GetLength((ArrayObject *)this);
  local_28->Length = uVar1;
  local_38 = TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>
                       ((SlabAllocatorBase<0> *)stai,1);
  local_40 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  ppAVar2 = Memory::PointerValue<Js::ArrayBufferBase>(&local_40);
  *local_38 = (unsigned_long)*ppAVar2;
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapTypedArrayInfo*,(TTD::NSSnapObjects::SnapObjectType)24>
            ((SnapObject *)alloc_local,local_28,(SlabAllocator *)stai,1,local_38);
  return;
}

Assistant:

void TypedArrayBase::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapTypedArrayInfo* stai = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapTypedArrayInfo>();
        stai->ArrayBufferAddr = TTD_CONVERT_VAR_TO_PTR_ID(this->GetArrayBuffer());
        stai->ByteOffset = this->GetByteOffset();
        stai->Length = this->GetLength();

        TTD_PTR_ID* depArray = alloc.SlabAllocateArray<TTD_PTR_ID>(1);
        depArray[0] = TTD_CONVERT_VAR_TO_PTR_ID(this->GetArrayBuffer());

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapTypedArrayInfo*, TTD::NSSnapObjects::SnapObjectType::SnapTypedArrayObject>(objData, stai, alloc, 1, depArray);
    }